

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void print_ex(vw *all,size_t ex_processed,size_t vals_found,size_t progress)

{
  _Setw _Var1;
  ostream *poVar2;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  
  poVar2 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0xe0),std::left);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  _Var1 = std::setw(9);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RCX);
  poVar2 = std::operator<<(poVar2,'%');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void print_ex(vw& all, size_t ex_processed, size_t vals_found, size_t progress)
{
  all.trace_message << std::left << std::setw(shared_data::col_example_counter) << ex_processed << " " << std::right
                    << std::setw(9) << vals_found << " " << std::right << std::setw(12) << progress << '%' << std::endl;
}